

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem_pool_test.c
# Opt level: O3

int main(void)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  void *p [20];
  long local_c8 [21];
  
  _mpp_log_l(4,"mpp_mem_pool_test","mpp_mem_pool_test start\n",0);
  lVar1 = mpp_mem_pool_init_f("main",0x400);
  if (lVar1 == 0) {
    pcVar5 = "mpp_mem_pool_test mpp_mem_pool_init failed\n";
LAB_0010127c:
    _mpp_log_l(2,"mpp_mem_pool_test",pcVar5,0);
    iVar3 = -1;
    pcVar5 = "mpp_mem_pool_test failed\n";
  }
  else {
    lVar4 = 0;
    pcVar5 = "mpp_mem_pool_test mpp_mem_pool_get failed\n";
    do {
      lVar2 = mpp_mem_pool_get_f("main",lVar1);
      local_c8[lVar4] = lVar2;
      if (lVar2 == 0) goto LAB_0010127c;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x14);
    lVar4 = 0;
    do {
      if (local_c8[lVar4] != 0) {
        mpp_mem_pool_put_f("main",lVar1);
        local_c8[lVar4] = 0;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 10);
    lVar4 = 0;
    do {
      lVar2 = mpp_mem_pool_get_f("main",lVar1);
      local_c8[lVar4] = lVar2;
      if (lVar2 == 0) goto LAB_0010127c;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 5);
    lVar4 = 0;
    pcVar5 = "mpp_mem_pool_test success\n";
    do {
      if (local_c8[lVar4] != 0) {
        mpp_mem_pool_put_f("main",lVar1);
        local_c8[lVar4] = 0;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x14);
    iVar3 = 0;
  }
  _mpp_log_l(4,"mpp_mem_pool_test",pcVar5,0);
  return iVar3;
}

Assistant:

int main()
{
    MppMemPool pool = NULL;
    size_t size = MPP_MEM_POOL_TEST_SIZE;
    void *p [MPP_MEM_POOL_TEST_COUNT];
    RK_U32 i;

    mpp_log("mpp_mem_pool_test start\n");

    pool = mpp_mem_pool_init(size);
    if (NULL == pool) {
        mpp_err("mpp_mem_pool_test mpp_mem_pool_init failed\n");
        goto mpp_mem_pool_test_failed;
    }

    for (i = 0; i < MPP_MEM_POOL_TEST_COUNT; i++) {
        p[i] = mpp_mem_pool_get(pool);
        if (!p[i]) {
            mpp_err("mpp_mem_pool_test mpp_mem_pool_get failed\n");
            goto mpp_mem_pool_test_failed;
        }
    }

    for (i = 0; i < MPP_MEM_POOL_TEST_COUNT / 2; i++) {
        if (p[i]) {
            mpp_mem_pool_put(pool, p[i]);
            p[i] = NULL;
        }
    }

    for (i = 0; i < MPP_MEM_POOL_TEST_COUNT / 4; i++) {
        p[i] = mpp_mem_pool_get(pool);
        if (!p[i]) {
            mpp_err("mpp_mem_pool_test mpp_mem_pool_get failed\n");
            goto mpp_mem_pool_test_failed;
        }
    }

    for (i = 0; i < MPP_MEM_POOL_TEST_COUNT; i++) {
        if (p[i]) {
            mpp_mem_pool_put(pool, p[i]);
            p[i] = NULL;
        }
    }

    mpp_log("mpp_mem_pool_test success\n");
    return MPP_OK;

mpp_mem_pool_test_failed:
    mpp_log("mpp_mem_pool_test failed\n");
    return MPP_NOK;
}